

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::ChangeSurfaceSeam(ON_NurbsSurface *this,int dir,double t)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_NurbsCurve *pOVar4;
  ON_NurbsCurve crv;
  ON_Interval current_domain;
  ON_NurbsCurve local_70;
  ON_Interval local_30;
  
  if ((uint)dir < 2) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    bVar2 = false;
    bVar1 = ON_Interval::Includes(&local_30,t,false);
    if (bVar1) {
      iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])
                        (this,(ulong)(uint)dir);
      bVar2 = true;
      if ((char)iVar3 != '\0') {
        ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
        ON_NurbsCurve::ON_NurbsCurve(&local_70);
        pOVar4 = ToCurve(this,dir,&local_70);
        if (pOVar4 == (ON_NurbsCurve *)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = ON_NurbsCurve::ChangeClosedCurveSeam(&local_70,t);
        }
        bVar1 = FromCurve(&local_70,this,dir);
        bVar2 = (bool)(bVar2 & bVar1);
        ON_NurbsCurve::~ON_NurbsCurve(&local_70);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool 
ON_NurbsSurface::ChangeSurfaceSeam( 
						int dir,
            double t 
            )
{
	bool rc = true;

  if ( dir < 0 || dir > 1 )
    return false;

  ON_Interval current_domain = Domain(dir);
	if( !current_domain.Includes( t) )
		rc = false;
	
	if(rc && IsClosed(dir) ){
		DestroySurfaceTree();
		ON_NurbsCurve crv;
		rc = ToCurve(*this, dir, &crv)!=nullptr;
		if(rc)
			rc = crv.ChangeClosedCurveSeam(t)!=0;
		rc = FromCurve(crv,*this, dir) && rc;
	}

	return rc;
}